

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geofile_operations.cpp
# Opt level: O2

int __thiscall
GEO::geofile::import_physical_entity
          (geofile *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *split_string_vector,string *import_path,int *line_number,geo_argument *physical_type)

{
  const_iterator __position;
  pointer pbVar1;
  bool bVar2;
  ostream *poVar3;
  int iVar4;
  char *pcVar5;
  pointer n;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
  local_a0;
  vector<int,_std::allocator<int>_> elements;
  string group_name;
  
  __position._M_current =
       (split_string_vector->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::erase(split_string_vector,__position);
  boost::algorithm::erase_all<std::__cxx11::string,char[2]>
            (__position._M_current,(char (*) [2])0x15a483);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::erase(split_string_vector,
          (split_string_vector->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish + -1);
  n = (split_string_vector->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string((string *)&group_name,(string *)n);
  elements.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  elements.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  elements.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pbVar1 = (split_string_vector->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  while (n = n + 1, n != pbVar1) {
    bVar2 = is_integer(n);
    if (!bVar2) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Error: Invalid value (line ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*line_number);
      poVar3 = std::operator<<(poVar3," of ");
      poVar3 = std::operator<<(poVar3,(string *)import_path);
      pcVar5 = ")";
      goto LAB_00123292;
    }
    local_a0.first._M_dataplus._M_p._0_4_ = std::__cxx11::stoi(n,(size_t *)0x0,10);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(&elements,(int *)&local_a0);
  }
  switch(*physical_type) {
  case ePhysical_Curve:
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::vector<int,_std::allocator<int>_>_&,_true>
              (&local_a0,&group_name,&elements);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>>
    ::_M_insert_unique<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>>
                *)&this->physical_curves_map,&local_a0);
    break;
  case ePhysical_Point:
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::vector<int,_std::allocator<int>_>_&,_true>
              (&local_a0,&group_name,&elements);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>>
    ::_M_insert_unique<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>>
                *)&this->physical_points_map,&local_a0);
    break;
  case ePhysical_Surface:
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::vector<int,_std::allocator<int>_>_&,_true>
              (&local_a0,&group_name,&elements);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>>
    ::_M_insert_unique<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>>
                *)&this->physical_surfaces_map,&local_a0);
    break;
  case ePhysical_Volume:
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::vector<int,_std::allocator<int>_>_&,_true>
              (&local_a0,&group_name,&elements);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>>
    ::_M_insert_unique<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>>
                *)&this->physical_volumes_map,&local_a0);
    break;
  default:
    poVar3 = std::operator<<((ostream *)&std::cout,"Error: Unrecognized Physical Element at line ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*line_number);
    poVar3 = std::operator<<(poVar3," of ");
    poVar3 = std::operator<<(poVar3,(string *)import_path);
    pcVar5 = ".";
LAB_00123292:
    poVar3 = std::operator<<(poVar3,pcVar5);
    std::endl<char,std::char_traits<char>>(poVar3);
    iVar4 = 1;
    goto LAB_00123335;
  }
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
  ::~pair(&local_a0);
  iVar4 = 0;
LAB_00123335:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&elements.super__Vector_base<int,_std::allocator<int>_>);
  std::__cxx11::string::~string((string *)&group_name);
  return iVar4;
}

Assistant:

int GEO::geofile::import_physical_entity(   std::vector<std::string> &split_string_vector,
                                            std::string &import_path,
                                            int &line_number,
                                            geo_argument &physical_type)
{
    auto it = split_string_vector.begin();
    split_string_vector.erase(it);
    boost::erase_all( *it, "\"" );
    it=std::prev(split_string_vector.end(),1);
    split_string_vector.erase(it);
    it = split_string_vector.begin();
    std::string group_name = *it++;
    std::vector<int> elements;
    auto ssv_end = split_string_vector.end();
    while (it != ssv_end)
    {
        if (is_integer(*it))
        {
            elements.push_back(std::stoi(*it++));
        }
        else
        {
            std::cout << "Error: Invalid value (line "
            << line_number << " of "
            << import_path << ")" << std::endl;
            return EXIT_FAILURE;
        }
    }
    switch (physical_type)
    {
    case ePhysical_Point:
        physical_points_map.insert({group_name, elements});
        break;
    case ePhysical_Curve:
        physical_curves_map.insert({group_name, elements});
        break;
    case ePhysical_Surface:
        physical_surfaces_map.insert({group_name, elements});
        break;
    case ePhysical_Volume:
        physical_volumes_map.insert({group_name, elements});
        break;
    default:
        std:: cout  << "Error: Unrecognized Physical Element at line "
                    << line_number << " of "
                    << import_path << "." << std::endl;
        return EXIT_FAILURE;
        break;
    }
    return EXIT_SUCCESS;
}